

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::ButtonBehavior
               (ImRect *bb,ImGuiID id,bool *out_hovered,bool *out_held,ImGuiButtonFlags flags)

{
  ImVec2 IVar1;
  ImGuiID IVar2;
  ImGuiWindow *window;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  ImGuiContext *g;
  uint uVar9;
  ulong uVar10;
  byte bVar11;
  bool bVar12;
  float t;
  ImVec2 IVar13;
  bool local_4c;
  
  pIVar4 = GImGui;
  window = GImGui->CurrentWindow;
  window->WriteAccessed = true;
  if (((uint)flags >> 8 & 1) != 0) {
    if (out_hovered != (bool *)0x0) {
      *out_hovered = false;
    }
    if (out_held != (bool *)0x0) {
      *out_held = false;
    }
    if (pIVar4->ActiveId == id) {
      ClearActiveID();
    }
    return false;
  }
  uVar10 = (ulong)(flags | 2);
  if ((flags & 0x1eU) != 0) {
    uVar10 = (ulong)(uint)flags;
  }
  pIVar3 = pIVar4->HoveredWindow;
  if (((uVar10 & 0x20) != 0) && (pIVar4->HoveredRootWindow == window)) {
    pIVar4->HoveredWindow = window;
  }
  bVar5 = ItemHoverable(bb,id);
  if (bVar5) {
    bVar11 = 1;
    if (((pIVar4->DragDropActive & 1U) != 0) && ((pIVar4->DragDropPayload).SourceId == id)) {
      bVar11 = ((byte)pIVar4->DragDropSourceFlags & 2) >> 1;
    }
  }
  else {
    bVar11 = 0;
  }
  uVar9 = (uint)uVar10;
  if ((((uVar9 >> 0xc & 1) == 0 || (~pIVar4->DragDropActive & 1U) != 0) ||
      ((pIVar4->DragDropSourceFlags & 4) != 0)) || (bVar5 = IsItemHovered(0x20), !bVar5)) {
LAB_0012bf5f:
    bVar5 = false;
  }
  else {
    SetHoveredID(id);
    t = pIVar4->HoveredIdTimer + 0.0001;
    iVar8 = CalcTypematicPressedRepeatAmount(t,t - (pIVar4->IO).DeltaTime,0.01,0.7);
    if (iVar8 == 0) {
      bVar11 = 1;
      goto LAB_0012bf5f;
    }
    FocusWindow(window);
    bVar11 = 1;
    bVar5 = true;
  }
  if (((uVar10 & 0x20) != 0) && (pIVar4->HoveredRootWindow == window)) {
    pIVar4->HoveredWindow = pIVar3;
  }
  if (bVar11 == 1 && (uVar10 & 0x40) != 0) {
    if (pIVar4->HoveredIdPreviousFrame == 0 || pIVar4->HoveredIdPreviousFrame == id)
    goto LAB_0012bfae;
LAB_0012bf9c:
    local_4c = false;
  }
  else {
    if (bVar11 == 0) goto LAB_0012bf9c;
LAB_0012bfae:
    if (((uVar9 >> 10 & 1) == 0) ||
       ((((pIVar4->IO).KeyCtrl == false && ((pIVar4->IO).KeyShift == false)) &&
        ((pIVar4->IO).KeyAlt == false)))) {
      if (((uVar10 & 2) != 0) && ((pIVar4->IO).MouseClicked[0] == true)) {
        SetActiveID(id,window);
        if ((uVar9 >> 0xd & 1) == 0) {
          SetFocusID(id,window);
        }
        FocusWindow(window);
      }
      if ((((uVar10 & 4) != 0) && ((pIVar4->IO).MouseClicked[0] != false)) ||
         (((uVar10 & 0x10) != 0 && ((pIVar4->IO).MouseDoubleClicked[0] == true)))) {
        if ((uVar9 >> 0xb & 1) == 0) {
          SetActiveID(id,window);
        }
        else {
          ClearActiveID();
        }
        FocusWindow(window);
        bVar5 = true;
      }
      if (((uVar10 & 8) != 0) && ((pIVar4->IO).MouseReleased[0] == true)) {
        if (((uVar10 & 1) == 0) ||
           ((pIVar4->IO).MouseDownDurationPrev[0] < (pIVar4->IO).KeyRepeatDelay)) {
          bVar5 = true;
        }
        ClearActiveID();
      }
      if (((((uVar10 & 1) != 0) && (pIVar4->ActiveId == id)) &&
          (0.0 < (pIVar4->IO).MouseDownDuration[0])) && (bVar6 = IsMouseClicked(0,true), bVar6)) {
        bVar5 = true;
      }
    }
    local_4c = true;
    if (bVar5) {
      pIVar4->NavDisableHighlight = true;
    }
  }
  if (((pIVar4->NavId == id) && (pIVar4->NavDisableHighlight == false)) &&
     (pIVar4->NavDisableMouseHover == true)) {
    IVar2 = pIVar4->ActiveId;
    if (IVar2 == id || IVar2 == 0) {
      if ((uVar9 >> 0xe & 1) == 0) {
LAB_0012c120:
        local_4c = true;
      }
    }
    else if (((uVar9 >> 0xe & 1) == 0) && (IVar2 == window->MoveId)) goto LAB_0012c120;
  }
  if (pIVar4->NavActivateDownId == id) {
    bVar12 = pIVar4->NavActivateId == id;
    bVar6 = IsNavInputPressed(0,(uVar9 & 1) * 2 + ImGuiInputReadMode_Pressed);
    if (bVar6 || bVar12) {
      bVar5 = true;
    }
    else if (pIVar4->ActiveId != id) goto LAB_0012c1a6;
    pIVar4->NavActivateId = id;
    SetActiveID(id,window);
    if ((bVar6 || bVar12) && (uVar10 >> 0xd & 1) == 0) {
      SetFocusID(id,window);
    }
    pIVar4->ActiveIdAllowNavDirFlags = 0xf;
  }
LAB_0012c1a6:
  if (pIVar4->ActiveId == id) {
    if (bVar5 != false) {
      pIVar4->ActiveIdHasBeenPressed = true;
    }
    if (pIVar4->ActiveIdSource == ImGuiInputSource_Nav) {
      if (pIVar4->NavActivateDownId != id) {
        ClearActiveID();
      }
      bVar6 = false;
      goto LAB_0012c20c;
    }
    if (pIVar4->ActiveIdSource == ImGuiInputSource_Mouse) {
      if (pIVar4->ActiveIdIsJustActivated == true) {
        IVar1 = (pIVar4->IO).MousePos;
        IVar13.x = IVar1.x - (bb->Min).x;
        IVar13.y = IVar1.y - (bb->Min).y;
        pIVar4->ActiveIdClickOffset = IVar13;
      }
      bVar6 = true;
      if ((pIVar4->IO).MouseDown[0] == false) {
        bVar12 = bVar5;
        if ((local_4c == true && (uVar10 & 2) != 0) && (pIVar4->DragDropActive == false)) {
          if ((uVar10 & 0x10) == 0) {
            cVar7 = '\0';
          }
          else {
            cVar7 = (pIVar4->IO).MouseDownWasDoubleClick[0];
          }
          if ((uVar10 & 1) == 0) {
            bVar6 = false;
          }
          else {
            bVar6 = (pIVar4->IO).KeyRepeatDelay <= (pIVar4->IO).MouseDownDurationPrev[0];
          }
          if ((cVar7 == '\0') && (bVar12 = true, bVar6)) {
            bVar12 = bVar5;
          }
        }
        ClearActiveID();
        bVar6 = false;
        bVar5 = bVar12;
      }
      if ((uVar9 >> 0xd & 1) == 0) {
        pIVar4->NavDisableHighlight = true;
      }
      goto LAB_0012c20c;
    }
  }
  bVar6 = false;
LAB_0012c20c:
  if (out_hovered != (bool *)0x0) {
    *out_hovered = local_4c;
  }
  if (out_held != (bool *)0x0) {
    *out_held = bVar6;
  }
  return bVar5;
}

Assistant:

bool ImGui::ButtonBehavior(const ImRect& bb, ImGuiID id, bool* out_hovered, bool* out_held, ImGuiButtonFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    if (flags & ImGuiButtonFlags_Disabled)
    {
        if (out_hovered) *out_hovered = false;
        if (out_held) *out_held = false;
        if (g.ActiveId == id) ClearActiveID();
        return false;
    }

    // Default behavior requires click+release on same spot
    if ((flags & (ImGuiButtonFlags_PressedOnClickRelease | ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_PressedOnRelease | ImGuiButtonFlags_PressedOnDoubleClick)) == 0)
        flags |= ImGuiButtonFlags_PressedOnClickRelease;

    ImGuiWindow* backup_hovered_window = g.HoveredWindow;
    if ((flags & ImGuiButtonFlags_FlattenChildren) && g.HoveredRootWindow == window)
        g.HoveredWindow = window;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    if (id != 0 && window->DC.LastItemId != id)
        ImGuiTestEngineHook_ItemAdd(&g, bb, id);
#endif

    bool pressed = false;
    bool hovered = ItemHoverable(bb, id);

    // Drag source doesn't report as hovered
    if (hovered && g.DragDropActive && g.DragDropPayload.SourceId == id && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoDisableHover))
        hovered = false;

    // Special mode for Drag and Drop where holding button pressed for a long time while dragging another item triggers the button
    if (g.DragDropActive && (flags & ImGuiButtonFlags_PressedOnDragDropHold) && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoHoldToOpenOthers))
        if (IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByActiveItem))
        {
            hovered = true;
            SetHoveredID(id);
            if (CalcTypematicPressedRepeatAmount(g.HoveredIdTimer + 0.0001f, g.HoveredIdTimer + 0.0001f - g.IO.DeltaTime, 0.01f, 0.70f)) // FIXME: Our formula for CalcTypematicPressedRepeatAmount() is fishy
            {
                pressed = true;
                FocusWindow(window);
            }
        }

    if ((flags & ImGuiButtonFlags_FlattenChildren) && g.HoveredRootWindow == window)
        g.HoveredWindow = backup_hovered_window;

    // AllowOverlap mode (rarely used) requires previous frame HoveredId to be null or to match. This allows using patterns where a later submitted widget overlaps a previous one.
    if (hovered && (flags & ImGuiButtonFlags_AllowItemOverlap) && (g.HoveredIdPreviousFrame != id && g.HoveredIdPreviousFrame != 0))
        hovered = false;

    // Mouse
    if (hovered)
    {
        if (!(flags & ImGuiButtonFlags_NoKeyModifiers) || (!g.IO.KeyCtrl && !g.IO.KeyShift && !g.IO.KeyAlt))
        {
            if ((flags & ImGuiButtonFlags_PressedOnClickRelease) && g.IO.MouseClicked[0])
            {
                SetActiveID(id, window);
                if (!(flags & ImGuiButtonFlags_NoNavFocus))
                    SetFocusID(id, window);
                FocusWindow(window);
            }
            if (((flags & ImGuiButtonFlags_PressedOnClick) && g.IO.MouseClicked[0]) || ((flags & ImGuiButtonFlags_PressedOnDoubleClick) && g.IO.MouseDoubleClicked[0]))
            {
                pressed = true;
                if (flags & ImGuiButtonFlags_NoHoldingActiveID)
                    ClearActiveID();
                else
                    SetActiveID(id, window); // Hold on ID
                FocusWindow(window);
            }
            if ((flags & ImGuiButtonFlags_PressedOnRelease) && g.IO.MouseReleased[0])
            {
                if (!((flags & ImGuiButtonFlags_Repeat) && g.IO.MouseDownDurationPrev[0] >= g.IO.KeyRepeatDelay))  // Repeat mode trumps <on release>
                    pressed = true;
                ClearActiveID();
            }

            // 'Repeat' mode acts when held regardless of _PressedOn flags (see table above).
            // Relies on repeat logic of IsMouseClicked() but we may as well do it ourselves if we end up exposing finer RepeatDelay/RepeatRate settings.
            if ((flags & ImGuiButtonFlags_Repeat) && g.ActiveId == id && g.IO.MouseDownDuration[0] > 0.0f && IsMouseClicked(0, true))
                pressed = true;
        }

        if (pressed)
            g.NavDisableHighlight = true;
    }

    // Gamepad/Keyboard navigation
    // We report navigated item as hovered but we don't set g.HoveredId to not interfere with mouse.
    if (g.NavId == id && !g.NavDisableHighlight && g.NavDisableMouseHover && (g.ActiveId == 0 || g.ActiveId == id || g.ActiveId == window->MoveId))
        if (!(flags & ImGuiButtonFlags_NoHoveredOnNav))
            hovered = true;

    if (g.NavActivateDownId == id)
    {
        bool nav_activated_by_code = (g.NavActivateId == id);
        bool nav_activated_by_inputs = IsNavInputPressed(ImGuiNavInput_Activate, (flags & ImGuiButtonFlags_Repeat) ? ImGuiInputReadMode_Repeat : ImGuiInputReadMode_Pressed);
        if (nav_activated_by_code || nav_activated_by_inputs)
            pressed = true;
        if (nav_activated_by_code || nav_activated_by_inputs || g.ActiveId == id)
        {
            // Set active id so it can be queried by user via IsItemActive(), equivalent of holding the mouse button.
            g.NavActivateId = id; // This is so SetActiveId assign a Nav source
            SetActiveID(id, window);
            if ((nav_activated_by_code || nav_activated_by_inputs) && !(flags & ImGuiButtonFlags_NoNavFocus))
                SetFocusID(id, window);
            g.ActiveIdAllowNavDirFlags = (1 << ImGuiDir_Left) | (1 << ImGuiDir_Right) | (1 << ImGuiDir_Up) | (1 << ImGuiDir_Down);
        }
    }

    bool held = false;
    if (g.ActiveId == id)
    {
        if (pressed)
            g.ActiveIdHasBeenPressed = true;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (g.ActiveIdIsJustActivated)
                g.ActiveIdClickOffset = g.IO.MousePos - bb.Min;
            if (g.IO.MouseDown[0])
            {
                held = true;
            }
            else
            {
                if (hovered && (flags & ImGuiButtonFlags_PressedOnClickRelease) && !g.DragDropActive)
                {
                    bool is_double_click_release = (flags & ImGuiButtonFlags_PressedOnDoubleClick) && g.IO.MouseDownWasDoubleClick[0];
                    bool is_repeating_already = (flags & ImGuiButtonFlags_Repeat) && g.IO.MouseDownDurationPrev[0] >= g.IO.KeyRepeatDelay; // Repeat mode trumps <on release>
                    if (!is_double_click_release && !is_repeating_already)
                        pressed = true;
                }
                ClearActiveID();
            }
            if (!(flags & ImGuiButtonFlags_NoNavFocus))
                g.NavDisableHighlight = true;
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            if (g.NavActivateDownId != id)
                ClearActiveID();
        }
    }

    if (out_hovered) *out_hovered = hovered;
    if (out_held) *out_held = held;

    return pressed;
}